

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpSetWebServerRootDir(char *rootDir)

{
  int iVar1;
  
  if (UpnpSdkInit == 0) {
    iVar1 = -0x74;
  }
  else {
    iVar1 = -0x65;
    if ((rootDir != (char *)0x0) && (*rootDir != '\0')) {
      membuffer_destroy(&gDocumentRootDir);
      iVar1 = web_server_set_root_dir(rootDir);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int UpnpSetWebServerRootDir(const char *rootDir)
{
	if (UpnpSdkInit == 0)
		return UPNP_E_FINISH;
	if ((rootDir == NULL) || (strlen(rootDir) == 0)) {
		return UPNP_E_INVALID_PARAM;
	}

	membuffer_destroy(&gDocumentRootDir);

	return web_server_set_root_dir(rootDir);
}